

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

void __thiscall f8n::runtime::MessageQueue::Dispatch(MessageQueue *this,IMessagePtr *message)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *__first;
  uint uVar3;
  _Base_ptr p_Var4;
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
  *this_00;
  MessageQueue *pMVar5;
  _Base_ptr p_Var6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var9;
  const_iterator __position;
  _Base_ptr p_Var10;
  long *plVar11;
  _Iter in_R8;
  _Base_ptr this_01;
  insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>_>
  __result;
  LockT lock;
  set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  copy;
  unique_lock<std::mutex> local_98;
  ulong local_88;
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
  *local_80;
  mutex *local_78;
  MessageQueue *local_70;
  _Base_ptr local_68;
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  local_60;
  
  iVar7 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_IMessage[2])();
  if (CONCAT44(extraout_var,iVar7) != 0) {
    iVar7 = (*((message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_IMessage[2])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x10))
              ((long *)CONCAT44(extraout_var_00,iVar7),
               (message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    return;
  }
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_owns = false;
  local_98._M_device = &this->queueMutex;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  __first = &(this->receivers)._M_t._M_impl.super__Rb_tree_header;
  __result.iter._M_node = in_R8._M_node;
  __result.container =
       (set<std::weak_ptr<f8n::runtime::IMessageTarget>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
        *)local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>>,std::insert_iterator<std::set<std::weak_ptr<f8n::runtime::IMessageTarget>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>>>
            ((__copy_move<false,false,std::bidirectional_iterator_tag> *)
             (this->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::weak_ptr<f8n::runtime::IMessageTarget>_>)__first,
             (_Base_ptr)&local_60,__result);
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var9 = (_Rb_tree_node_base *)&this->receivers;
    local_88 = 0;
    p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_80 = (_Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
                *)p_Var9;
    local_78 = &this->queueMutex;
    local_70 = this;
    local_68 = &__first->_M_header;
    do {
      plVar11 = *(long **)(p_Var10 + 1);
      p_Var4 = p_Var10[1]._M_parent;
      this_01 = p_Var4;
      if (p_Var4 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&p_Var4->_M_parent + 4);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        else {
          piVar1 = (int *)((long)&p_Var4->_M_parent + 4);
          *piVar1 = *piVar1 + 1;
        }
        if (p_Var4 != (_Base_ptr)0x0) {
          p_Var9 = (_Rb_tree_node_base *)(ulong)*(uint *)&p_Var4->_M_parent;
          do {
            uVar8 = (uint)p_Var9;
            if (uVar8 == 0) {
              this_01 = (_Base_ptr)0x0;
              break;
            }
            LOCK();
            uVar3 = *(uint *)&p_Var4->_M_parent;
            if (uVar8 == uVar3) {
              *(uint *)&p_Var4->_M_parent = uVar8 + 1;
            }
            else {
              p_Var9 = (_Rb_tree_node_base *)(ulong)uVar3;
            }
            UNLOCK();
          } while (uVar8 != uVar3);
        }
      }
      if (this_01 == (_Base_ptr)0x0) {
        plVar11 = (long *)0x0;
      }
      else {
        p_Var9 = (_Rb_tree_node_base *)0x0;
        if (*(int *)&this_01->_M_parent == 0) {
          plVar11 = (long *)0x0;
        }
      }
      if (plVar11 == (long *)0x0) {
        local_88 = CONCAT71((int7)((ulong)p_Var9 >> 8),1);
      }
      else {
        (**(code **)(*plVar11 + 0x10))
                  (plVar11,(message->
                           super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
      }
      if (this_01 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      if (p_Var4 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&p_Var4->_M_parent + 4);
          iVar7 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar7 = *(int *)((long)&p_Var4->_M_parent + 4);
          *(int *)((long)&p_Var4->_M_parent + 4) = iVar7 + -1;
        }
        if (iVar7 == 1) {
          (**(code **)(*(long *)p_Var4 + 0x18))(p_Var4);
        }
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      p_Var6 = local_68;
      pMVar5 = local_70;
      p_Var10 = p_Var9;
    } while ((_Rb_tree_header *)p_Var9 != p_Var2);
    if ((local_88 & 1) != 0) {
      local_98._M_device = local_78;
      local_98._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_98);
      this_00 = local_80;
      local_98._M_owns = true;
      __position._M_node = (pMVar5->receivers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (__position._M_node != p_Var6) {
        if ((__position._M_node[1]._M_parent == (_Base_ptr)0x0) ||
           (*(int *)&(__position._M_node[1]._M_parent)->_M_parent == 0)) {
          __position._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,std::weak_ptr<f8n::runtime::IMessageTarget>,std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>>,f8n::runtime::MessageQueue::WeakPtrLess,std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>>>
               ::erase_abi_cxx11_(this_00,__position);
        }
        else {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_98);
    }
  }
  std::
  _Rb_tree<std::weak_ptr<f8n::runtime::IMessageTarget>,_std::weak_ptr<f8n::runtime::IMessageTarget>,_std::_Identity<std::weak_ptr<f8n::runtime::IMessageTarget>_>,_f8n::runtime::MessageQueue::WeakPtrLess,_std::allocator<std::weak_ptr<f8n::runtime::IMessageTarget>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MessageQueue::Dispatch(IMessagePtr message) {
    if (message->Target()) {
        message->Target()->ProcessMessage(*message);
    }
    else {
        std::set<IWeakMessageTarget, WeakPtrLess> copy;

        /* copy to dispatch outside of a lock */
        {
            LockT lock(this->queueMutex);
            std::copy(
                receivers.begin(),
                receivers.end(),
                std::inserter(copy, copy.begin()));
        }

        /* dispatch */
        bool prune = false;
        for (auto receiver : copy) {
            auto shared = receiver.lock();
            if (shared) {
                shared->ProcessMessage(*message);
            }
            else {
                prune = true;
            }
        }

        if (prune) { /* at least one of our weak_ptrs is dead. */
            LockT lock(this->queueMutex);
            auto it = this->receivers.begin();
            while (it != this->receivers.end()) {
                if (it->expired()) {
                    it = this->receivers.erase(it);
                }
                else {
                    ++it;
                }
            }
        }
    }
}